

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_12ebf5d::HandleFilesMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  string *psVar5;
  const_iterator cVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  size_t sVar8;
  cmGlobalGenerator *this;
  char *pcVar9;
  pointer pbVar10;
  static_string_view name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  undefined1 auVar11 [12];
  string destination;
  string type;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  files;
  Helper helper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  ostringstream e;
  cmInstallCommandArguments ica;
  string local_4d0;
  undefined4 local_4b0;
  MessageType local_4ac;
  cmExecutionStatus *local_4a8;
  int local_49c;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_498;
  string local_490;
  uint local_46c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  undefined8 local_450;
  string *local_448;
  cmGlobalGenerator *local_440;
  Helper local_438;
  string local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  string local_3c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  basic_string_view<char,_std::char_traits<char>_> local_390;
  undefined8 local_380;
  char *local_378;
  size_type local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  undefined8 local_360;
  char *local_358;
  ios_base local_320 [264];
  ParseResult local_218;
  cmInstallCommandArguments local_1e8;
  
  local_4a8 = status;
  Helper::Helper(&local_438,status);
  local_49c = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_408,local_438.DefaultComponentName._M_dataplus._M_p,
             local_438.DefaultComponentName._M_dataplus._M_p +
             local_438.DefaultComponentName._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_1e8,&local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar9 = "FILES";
  if (local_49c == 0) {
    pcVar9 = "PROGRAMS";
  }
  name.super_string_view._M_len = (ulong)(local_49c == 0) * 3 + 5;
  name.super_string_view._M_str = pcVar9;
  cmArgumentParser<void>::
  Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_1e8.super_cmArgumentParser<void>,name,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_468);
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_218,&local_1e8.super_cmArgumentParser<void>,args,&local_3e8,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_218);
  if (local_3e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_3e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_390._M_str = (pbVar10->_M_dataplus)._M_p;
    local_390._M_len = pbVar10->_M_string_length;
    local_380 = 0x19;
    local_378 = " given unknown argument \"";
    local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((local_3e8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_370 = (local_3e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_360 = 2;
    local_358 = "\".";
    views._M_len = 4;
    views._M_array = &local_390;
    cmCatViews_abi_cxx11_(&local_490,views);
    std::__cxx11::string::_M_assign((string *)&local_4a8->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
    goto LAB_0038e02c;
  }
  psVar5 = cmInstallCommandArguments::GetType_abi_cxx11_(&local_1e8);
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_490,pcVar1,pcVar1 + psVar5->_M_string_length);
  if ((local_490._M_string_length == 0) ||
     (cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(anonymous_namespace)::allowedTypes_abi_cxx11_,&local_490),
     cVar6._M_node != (_Base_ptr)((anonymous_namespace)::allowedTypes_abi_cxx11_ + 8))) {
    if (local_468.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_468.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = true;
    }
    else {
      psVar5 = cmInstallCommandArguments::GetRename_abi_cxx11_(&local_1e8);
      if ((psVar5->_M_string_length != 0) &&
         (0x20 < (ulong)((long)local_468.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_468.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_390._M_str = (pbVar10->_M_dataplus)._M_p;
        local_390._M_len = pbVar10->_M_string_length;
        local_380 = 0x2d;
        local_378 = " given RENAME option with more than one file.";
        views_00._M_len = 2;
        views_00._M_array = &local_390;
        cmCatViews_abi_cxx11_(&local_4d0,views_00);
        std::__cxx11::string::_M_assign((string *)&local_4a8->Error);
        goto LAB_0038ded7;
      }
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = Helper::MakeFilesFullPath
                        (&local_438,
                         (((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,&local_468
                         ,&local_3a8);
      if (bVar3) {
        PVar4 = cmMakefile::GetPolicyStatus(local_438.Makefile,CMP0062,false);
        local_450 = CONCAT44(extraout_var,PVar4);
        local_440 = cmMakefile::GetGlobalGenerator(local_438.Makefile);
        local_448 = local_468.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_468.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_468.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_46c = (int)local_450 - 2;
          pbVar10 = local_468.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            bVar3 = cmGlobalGenerator::IsExportedTargetsFile(local_440,pbVar10);
            if (bVar3) {
              auVar11 = std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_390);
              if (local_46c < 3) {
                local_4ac = FATAL_ERROR;
                local_4b0 = (undefined4)CONCAT71(auVar11._1_7_,1);
                bVar3 = false;
                pcVar9 = "may";
              }
              else {
                if ((int)local_450 == 1) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_
                            (&local_4d0,(cmPolicies *)0x3e,auVar11._8_4_);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_390,local_4d0._M_dataplus._M_p,
                                      local_4d0._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                    operator_delete(local_4d0._M_dataplus._M_p,
                                    local_4d0.field_2._M_allocated_capacity + 1);
                  }
                  bVar3 = false;
                  pcVar9 = "should";
                }
                else {
                  pcVar9 = (char *)0x0;
                  bVar3 = true;
                }
                local_4b0 = 0;
                local_4ac = AUTHOR_WARNING;
              }
              if (!bVar3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_390,"The file\n  ",0xb);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&local_390,(pbVar10->_M_dataplus)._M_p,
                                    pbVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\nwas generated by the export() command.  It ",0x2c);
                sVar8 = strlen(pcVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,sVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,
                           " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                           ,0x86);
                pcVar2 = local_438.Makefile;
                std::__cxx11::stringbuf::str();
                cmMakefile::IssueMessage(pcVar2,local_4ac,&local_4d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                  operator_delete(local_4d0._M_dataplus._M_p,
                                  local_4d0.field_2._M_allocated_capacity + 1);
                }
                if ((char)local_4b0 != '\0') {
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_390);
                  std::ios_base::~ios_base(local_320);
                  goto LAB_0038e000;
                }
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_390);
              std::ios_base::~ios_base(local_320);
            }
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 != local_448);
        }
        bVar3 = cmInstallCommandArguments::Finalize(&local_1e8);
        if (!bVar3) goto LAB_0038e000;
        if ((local_490._M_string_length != 0) &&
           (psVar5 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_1e8),
           psVar5->_M_string_length != 0)) {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_390._M_str = (pbVar10->_M_dataplus)._M_p;
          local_390._M_len = pbVar10->_M_string_length;
          local_380 = 0x45;
          local_378 = " given both TYPE and DESTINATION arguments. You may only specify one.";
          views_01._M_len = 2;
          views_01._M_array = &local_390;
          cmCatViews_abi_cxx11_(&local_4d0,views_01);
          std::__cxx11::string::_M_assign((string *)&local_4a8->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0038e000;
        }
        Helper::GetDestinationForType(&local_4d0,&local_438,&local_1e8,&local_490);
        pcVar2 = local_438.Makefile;
        bVar3 = local_4d0._M_string_length != 0;
        if (local_4d0._M_string_length == 0) {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_390._M_str = (pbVar10->_M_dataplus)._M_p;
          local_390._M_len = pbVar10->_M_string_length;
          local_380 = 0x16;
          local_378 = " given no DESTINATION!";
          views_03._M_len = 2;
          views_03._M_array = &local_390;
          cmCatViews_abi_cxx11_(&local_3c8,views_03);
          std::__cxx11::string::_M_assign((string *)&local_4a8->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          CreateInstallFilesGenerator
                    ((anon_unknown_dwarf_12ebf5d *)&local_390,local_438.Makefile,&local_3a8,
                     &local_1e8,local_49c == 0,&local_4d0);
          local_498._M_head_impl = (cmInstallGenerator *)local_390._M_len;
          local_390._M_len = 0;
          cmMakefile::AddInstallGenerator
                    (pcVar2,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                             *)&local_498);
          if (local_498._M_head_impl != (cmInstallGenerator *)0x0) {
            (*((local_498._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
          }
          local_498._M_head_impl = (cmInstallGenerator *)0x0;
          if ((cmInstallGenerator *)local_390._M_len != (cmInstallGenerator *)0x0) {
            (*((cmScriptGenerator *)local_390._M_len)->_vptr_cmScriptGenerator[1])();
          }
          this = cmMakefile::GetGlobalGenerator(local_438.Makefile);
          psVar5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_1e8);
          cmGlobalGenerator::AddInstallComponent(this,psVar5);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_0038e000:
        bVar3 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3a8);
    }
  }
  else {
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_390._M_str = (pbVar10->_M_dataplus)._M_p;
    local_390._M_len = pbVar10->_M_string_length;
    local_380 = 0x11;
    local_378 = " given non-type \"";
    local_370 = local_490._M_string_length;
    local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_490._M_dataplus._M_p;
    local_360 = 0x15;
    local_358 = "\" with TYPE argument.";
    views_02._M_len = 4;
    views_02._M_array = &local_390;
    cmCatViews_abi_cxx11_(&local_4d0,views_02);
    std::__cxx11::string::_M_assign((string *)&local_4a8->Error);
LAB_0038ded7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
LAB_0038e02c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_468);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.DefaultComponentName._M_dataplus._M_p != &local_438.DefaultComponentName.field_2)
  {
    operator_delete(local_438.DefaultComponentName._M_dataplus._M_p,
                    local_438.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool HandleFilesMode(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(helper.DefaultComponentName);
  ArgumentParser::MaybeEmpty<std::vector<std::string>> files;
  ica.Bind(programs ? "PROGRAMS"_s : "FILES"_s, files);
  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  std::string type = ica.GetType();
  if (!type.empty() && allowedTypes.count(type) == 0) {
    status.SetError(
      cmStrCat(args[0], " given non-type \"", type, "\" with TYPE argument."));
    return false;
  }

  const std::vector<std::string>& filesVector = files;

  // Check if there is something to do.
  if (filesVector.empty()) {
    return true;
  }

  if (!ica.GetRename().empty() && filesVector.size() > 1) {
    // The rename option works only with one file.
    status.SetError(
      cmStrCat(args[0], " given RENAME option with more than one file."));
    return false;
  }

  std::vector<std::string> absFiles;
  if (!helper.MakeFilesFullPath(args[0].c_str(), filesVector, absFiles)) {
    return false;
  }

  cmPolicies::PolicyStatus policyStatus =
    helper.Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator* gg = helper.Makefile->GetGlobalGenerator();
  for (std::string const& file : filesVector) {
    if (gg->IsExportedTargetsFile(file)) {
      const char* modal = nullptr;
      std::ostringstream e;
      MessageType messageType = MessageType::AUTHOR_WARNING;

      switch (policyStatus) {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = MessageType::FATAL_ERROR;
          break;
      }
      if (modal) {
        e << "The file\n  " << file
          << "\nwas generated by the export() "
             "command.  It "
          << modal
          << " not be installed with the "
             "install() command.  Use the install(EXPORT) mechanism "
             "instead.  See the cmake-packages(7) manual for more.\n";
        helper.Makefile->IssueMessage(messageType, e.str());
        if (messageType == MessageType::FATAL_ERROR) {
          return false;
        }
      }
    }
  }

  if (!ica.Finalize()) {
    return false;
  }

  if (!type.empty() && !ica.GetDestination().empty()) {
    status.SetError(cmStrCat(args[0],
                             " given both TYPE and DESTINATION arguments. "
                             "You may only specify one."));
    return false;
  }

  std::string destination = helper.GetDestinationForType(&ica, type);
  if (destination.empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Create the files install generator.
  helper.Makefile->AddInstallGenerator(CreateInstallFilesGenerator(
    helper.Makefile, absFiles, ica, programs, destination));

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
    ica.GetComponent());

  return true;
}